

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall
aeron::ClientConductor::lingerAllResources(ClientConductor *this,longlong now,ImageList *imageList)

{
  long lVar1;
  ulong uVar2;
  __shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (imageList != (ImageList *)0x0) {
    lVar1 = 0xa0;
    for (uVar2 = 0; uVar2 < imageList->m_length; uVar2 = uVar2 + 1) {
      std::__shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 (__shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)(imageList->m_images->m_termBuffers)._M_elems + lVar1 + -8));
      lingerResource(this,now,(shared_ptr<aeron::LogBuffers> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      lVar1 = lVar1 + 0x128;
    }
    lingerResource(this,now,imageList);
  }
  return;
}

Assistant:

void ClientConductor::lingerAllResources(long long now, struct ImageList *imageList)
{
    if (nullptr != imageList)
    {
        for (std::size_t i = 0; i < imageList->m_length; i++)
        {
            lingerResource(now, imageList->m_images[i].logBuffers());
        }

        lingerResource(now, imageList);
    }
}